

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

void nghttp2_session_keep_idle_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  
  pnVar1 = session->idle_stream_tail;
  if (pnVar1 == (nghttp2_stream *)0x0) {
    session->idle_stream_head = stream;
  }
  else {
    pnVar1->closed_next = stream;
    stream->closed_prev = pnVar1;
  }
  session->idle_stream_tail = stream;
  session->num_idle_streams = session->num_idle_streams + 1;
  return;
}

Assistant:

void nghttp2_session_keep_idle_stream(nghttp2_session *session,
                                      nghttp2_stream *stream) {
  DEBUGF("stream: keep idle stream(%p)=%d, state=%d\n", stream,
         stream->stream_id, stream->state);

  if (session->idle_stream_tail) {
    session->idle_stream_tail->closed_next = stream;
    stream->closed_prev = session->idle_stream_tail;
  } else {
    session->idle_stream_head = stream;
  }
  session->idle_stream_tail = stream;

  ++session->num_idle_streams;
}